

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

void __thiscall soul::Value::Value(Value *this,float v)

{
  PackedData local_40;
  Type local_28;
  
  local_28.category = primitive;
  local_28.arrayElementCategory = invalid;
  local_28.isRef = false;
  local_28.isConstant = false;
  local_28.primitiveType.type = float32;
  local_28.boundingSize = 0;
  local_28.arrayElementBoundingSize = 0;
  local_28.structure.object = (Structure *)0x0;
  Value(this,&local_28);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_28.structure.object);
  getData(&local_40,this);
  if (local_40.size == 4) {
    *(float *)local_40.data = v;
    return;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","setAs",0x161);
}

Assistant:

Value::Value (float    v)  : Value (Type (PrimitiveType::float32))   { getData().setAs (v); }